

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::Clause::Clause(Clause *this,Clause *from,bool use_extra)

{
  int iVar1;
  Clause CVar2;
  int local_20;
  int i;
  bool use_extra_local;
  Clause *from_local;
  Clause *this_local;
  
  this->header = from->header;
  this->header = (anon_struct_4_5_613047fb_for_header)
                 ((uint)this->header & 0xfffffff7 | (uint)use_extra << 3);
  for (local_20 = 0; iVar1 = size(from), local_20 < iVar1; local_20 = local_20 + 1) {
    CVar2.header = (anon_struct_4_5_613047fb_for_header)operator[](from,local_20);
    this[(long)local_20 + 1].header = CVar2.header;
  }
  if (((uint)this->header >> 3 & 1) != 0) {
    if (((uint)this->header >> 2 & 1) == 0) {
      this[(ulong)((uint)this->header >> 5) + 1].header =
           from[(ulong)((uint)this->header >> 5) + 1].header;
    }
    else {
      this[(ulong)((uint)this->header >> 5) + 1].header =
           from[(ulong)((uint)this->header >> 5) + 1].header;
    }
  }
  return;
}

Assistant:

Clause(const Clause& from, bool use_extra){
        header           = from.header;
        header.has_extra = use_extra;   // NOTE: the copied clause may lose the extra field.

        for (int i = 0; i < from.size(); i++)
            data[i].lit = from[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = from.data[header.size].act;
            else 
                data[header.size].abs = from.data[header.size].abs;
    }
    }